

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

int connection_set_max_frame_size(CONNECTION_HANDLE connection,uint32_t max_frame_size)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (connection == (CONNECTION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x5b1;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x5b1;
    }
    pcVar4 = "NULL connection";
    iVar2 = 0x5b0;
  }
  else if (max_frame_size < 0x200) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x5b8;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x5b8;
    }
    pcVar4 = "max_frame_size too small";
    iVar2 = 0x5b7;
  }
  else {
    if (connection->connection_state == CONNECTION_STATE_START) {
      connection->max_frame_size = max_frame_size;
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x5c0;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x5c0;
    }
    pcVar4 = "Connection already open";
    iVar2 = 0x5bf;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
            ,"connection_set_max_frame_size",iVar2,1,pcVar4);
  return iVar3;
}

Assistant:

int connection_set_max_frame_size(CONNECTION_HANDLE connection, uint32_t max_frame_size)
{
    int result;

    /* Codes_S_R_S_CONNECTION_01_163: [If connection is NULL, connection_set_max_frame_size shall fail and return a non-zero value.] */
    if (connection == NULL)
    {
        LogError("NULL connection");
        result = MU_FAILURE;
    }
    /* Codes_S_R_S_CONNECTION_01_150: [If the max_frame_size is invalid then connection_set_max_frame_size shall fail and return a non-zero value.] */
    /* Codes_S_R_S_CONNECTION_01_167: [Both peers MUST accept frames of up to 512 (MIN-MAX-FRAME-SIZE) octets.] */
    else if (max_frame_size < 512)
    {
        LogError("max_frame_size too small");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_01_157: [If connection_set_max_frame_size is called after the initial Open frame has been sent, it shall fail and return a non-zero value.] */
        if (connection->connection_state != CONNECTION_STATE_START)
        {
            LogError("Connection already open");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_S_R_S_CONNECTION_01_148: [connection_set_max_frame_size shall set the max_frame_size associated with a connection.] */
            /* Codes_S_R_S_CONNECTION_01_164: [If connection_set_max_frame_size fails, the previous max_frame_size setting shall be retained.] */
            connection->max_frame_size = max_frame_size;

            /* Codes_S_R_S_CONNECTION_01_149: [On success connection_set_max_frame_size shall return 0.] */
            result = 0;
        }
    }

    return result;
}